

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

Quat rw::slerp(Quat *q,Quat *p,float32 a)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar5;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Quat QVar9;
  undefined8 local_48;
  undefined8 local_38;
  undefined1 auVar6 [16];
  
  local_48._0_4_ = (float)q->x;
  local_48._4_4_ = (float)q->y;
  local_38._0_4_ = (float)q->z;
  local_38._4_4_ = (float)q->w;
  fVar5 = (float)p->z * (float)local_38 +
          local_48._4_4_ * (float)p->y +
          local_38._4_4_ * (float)p->w + (float)p->x * (float)local_48;
  if (fVar5 < -fVar5) {
    local_38 = local_38 ^ 0x8000000080000000;
    local_48 = local_48 ^ 0x8000000080000000;
    fVar5 = -fVar5;
  }
  fVar5 = acosf(fVar5);
  if (1e-05 < fVar5) {
    fVar3 = sinf(fVar5);
    fVar4 = sinf((1.0 - (float)a) * fVar5);
    fVar5 = sinf(fVar5 * (float)a);
    auVar7._4_4_ = extraout_XMM0_Db;
    auVar7._0_4_ = fVar4;
    auVar7._8_4_ = extraout_XMM0_Db;
    auVar7._12_4_ = extraout_XMM0_Db_00;
    auVar6._8_8_ = auVar7._8_8_;
    auVar6._4_4_ = fVar5;
    auVar6._0_4_ = fVar4;
    auVar8._4_4_ = fVar3;
    auVar8._0_4_ = fVar3;
    auVar8._8_4_ = fVar3;
    auVar8._12_4_ = fVar3;
    auVar8 = divps(auVar6,auVar8);
    fVar5 = auVar8._0_4_;
    fVar3 = auVar8._4_4_;
    local_48._0_4_ = (float)p->x * fVar3 + (float)local_48 * fVar5;
    local_48._4_4_ = (float)p->y * fVar3 + local_48._4_4_ * fVar5;
    uVar1 = p->z;
    uVar2 = p->w;
    local_38 = CONCAT44(local_38._4_4_ * fVar5 + (float)uVar2 * fVar3,
                        (float)local_38 * fVar5 + (float)uVar1 * fVar3);
  }
  QVar9.y = (float32)local_48._4_4_;
  QVar9.x = (float32)(float)local_48;
  QVar9.z = (float32)(int)local_38;
  QVar9.w = (float32)(int)(local_38 >> 0x20);
  return QVar9;
}

Assistant:

Quat
slerp(const Quat &q, const Quat &p, float32 a)
{
	float32 c;
	Quat q1 = q;
	c = dot(q1, p);
	if(c < 0.0f){
		c = -c;
		q1 = negate(q1);
	}
	float32 phi = acosf(c);
	if(phi > 0.00001f){
		float32 s = sinf(phi);
		return add(scale(q1, sinf((1.0f-a)*phi)/s),
		           scale(p,  sinf(a*phi)/s));
	}
	return q1;
}